

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmain.cpp
# Opt level: O3

void __thiscall CTcMain::CTcMain(CTcMain *this,CResLoader *res_loader,char *default_charset)

{
  char *default_charset_00;
  CTcTokenizer *this_00;
  CTcPrsMem *this_01;
  CTcParser *this_02;
  CTcDataStream *pCVar1;
  CTcCodeStream *pCVar2;
  CTcGenTarg *this_03;
  EVP_PKEY_CTX *ctx;
  char mapname [32];
  char csbuf [4096];
  char acStack_1048 [32];
  char local_1028 [4104];
  
  if (default_charset == (char *)0x0) {
    default_charset = local_1028;
    os_get_charmap(default_charset,3);
  }
  if (console_mapper_ == (CCharmapToLocal *)0x0) {
    os_get_charmap(acStack_1048,1);
    console_mapper_ = CCharmapToLocal::load(res_loader,acStack_1048);
    if (console_mapper_ == (CCharmapToLocal *)0x0) {
      console_mapper_ = CCharmapToLocal::load(res_loader,"us-ascii");
    }
  }
  this->res_loader_ = res_loader;
  this->err_options_ = 4;
  this->suppress_list_ = (int *)0x0;
  this->suppress_cnt_ = 0;
  default_charset_00 = lib_copy_str(default_charset);
  this->default_charset_ = default_charset_00;
  this_00 = (CTcTokenizer *)operator_new(0xd70);
  CTcTokenizer::CTcTokenizer(this_00,this->res_loader_,default_charset_00);
  G_tok = this_00;
  this_01 = (CTcPrsMem *)operator_new(0x20);
  CTcPrsMem::CTcPrsMem(this_01);
  G_prsmem = this_01;
  this_02 = (CTcParser *)operator_new(0x268);
  CTcParser::CTcParser(this_02);
  G_prs = this_02;
  pCVar1 = (CTcDataStream *)operator_new(0x68);
  CTcDataStream::CTcDataStream(pCVar1,'\x01');
  G_ds = pCVar1;
  pCVar2 = (CTcCodeStream *)operator_new(0xf0);
  CTcCodeStream::CTcCodeStream(pCVar2,'\x02');
  G_cs_main = pCVar2;
  pCVar2 = (CTcCodeStream *)operator_new(0xf0);
  CTcCodeStream::CTcCodeStream(pCVar2,'\t');
  G_cs = G_cs_main;
  G_cs_static = pCVar2;
  pCVar1 = (CTcDataStream *)operator_new(0x68);
  CTcDataStream::CTcDataStream(pCVar1,'\x03');
  G_os = pCVar1;
  pCVar1 = (CTcDataStream *)operator_new(0x68);
  CTcDataStream::CTcDataStream(pCVar1,'\b');
  G_icmod_stream = pCVar1;
  pCVar1 = (CTcDataStream *)operator_new(0x68);
  CTcDataStream::CTcDataStream(pCVar1,'\x04');
  G_dict_stream = pCVar1;
  pCVar1 = (CTcDataStream *)operator_new(0x68);
  CTcDataStream::CTcDataStream(pCVar1,'\x05');
  G_gramprod_stream = pCVar1;
  pCVar1 = (CTcDataStream *)operator_new(0x68);
  CTcDataStream::CTcDataStream(pCVar1,'\x06');
  G_bignum_stream = pCVar1;
  pCVar1 = (CTcDataStream *)operator_new(0x68);
  CTcDataStream::CTcDataStream(pCVar1,'\f');
  G_rexpat_stream = pCVar1;
  pCVar1 = (CTcDataStream *)operator_new(0x68);
  CTcDataStream::CTcDataStream(pCVar1,'\a');
  G_int_class_stream = pCVar1;
  pCVar1 = (CTcDataStream *)operator_new(0x68);
  CTcDataStream::CTcDataStream(pCVar1,'\n');
  G_static_init_id_stream = pCVar1;
  pCVar1 = (CTcDataStream *)operator_new(0x68);
  ctx = (EVP_PKEY_CTX *)0xb;
  CTcDataStream::CTcDataStream(pCVar1,'\v');
  G_lcl_stream = pCVar1;
  this_03 = (CTcGenTarg *)operator_new(0x100);
  CTcGenTarg::CTcGenTarg(this_03);
  G_cg = this_03;
  CTcParser::init(G_prs,ctx);
  this->error_count_ = 0;
  this->warning_count_ = 0;
  this->first_error_ = 0;
  this->first_warning_ = 0;
  this->max_error_count_ = 100;
  G_disasm_out = (CTcUnasOut *)0x0;
  return;
}

Assistant:

CTcMain::CTcMain(CResLoader *res_loader, const char *default_charset)
{
    char csbuf[OSFNMAX];
    
    /* 
     *   if the caller didn't provide a default character set, ask the OS
     *   what we should use
     */
    if (default_charset == 0)
    {
        /* 
         *   ask the OS what to use for file contents, since we use this
         *   character set to translate the text we read from source files 
         */
        os_get_charmap(csbuf, OS_CHARMAP_FILECONTENTS);
        
        /* use our OS-provided character set */
        default_charset = csbuf;
    }

    /* if there's no static console output character map, create one */
    if (console_mapper_ == 0)
    {
        char mapname[32];

        /* get the console character set name */
        os_get_charmap(mapname, OS_CHARMAP_DISPLAY);

        /* create a resource loader for the console character map */
        console_mapper_ = CCharmapToLocal::load(res_loader, mapname);

        /* if that failed, create an ASCII mapper */
        if (console_mapper_ == 0)
            console_mapper_ = CCharmapToLocal::load(res_loader, "us-ascii");
    }
    
    /* remember our resource loader */
    res_loader_ = res_loader;
    
    /* 
     *   set default options - minimum verbosity, no numeric error codes,
     *   show standard warnings but not pedantic warnings, not test mode 
     */
    err_options_ = TCMAIN_ERR_WARNINGS;

    /* we have no warning suppression list yet */
    suppress_list_ = 0;
    suppress_cnt_ = 0;

    /* remember our default character set */
    default_charset_ = lib_copy_str(default_charset);

    /* create the tokenizer */
    G_tok = new CTcTokenizer(res_loader_, default_charset_);
    
    /* 
     *   Create the parser and node memory pool.  Create the memory pool
     *   first, because the parser allocates objects out of the pool. 
     */
    G_prsmem = new CTcPrsMem();
    G_prs = new CTcParser();

    /* create the generator data stream (for constant data) */
    G_ds = new CTcDataStream(TCGEN_DATA_STREAM);

    /* create the primary generator code stream */
    G_cs_main = new CTcCodeStream(TCGEN_CODE_STREAM);

    /* create the static initializer code stream */
    G_cs_static = new CTcCodeStream(TCGEN_STATIC_CODE_STREAM);

    /* make the primary code stream active */
    G_cs = G_cs_main;

    /* create the generator object data stream */
    G_os = new CTcDataStream(TCGEN_OBJECT_STREAM);

    /* create the intrinsic class modifier object data stream */
    G_icmod_stream = new CTcDataStream(TCGEN_ICMOD_STREAM);

    /* create the dictionary object data stream */
    G_dict_stream = new CTcDataStream(TCGEN_DICT_STREAM);

    /* create the grammar-production object data stream */
    G_gramprod_stream = new CTcDataStream(TCGEN_GRAMPROD_STREAM);

    /* create the BigNumber object data stream */
    G_bignum_stream = new CTcDataStream(TCGEN_BIGNUM_STREAM);

    /* create the RexPattern object data stream */
    G_rexpat_stream = new CTcDataStream(TCGEN_REXPAT_STREAM);

    /* create the IntrinsicClass object data stream */
    G_int_class_stream = new CTcDataStream(TCGEN_INTCLASS_STREAM);

    /* create the static initializer identifier stream */
    G_static_init_id_stream = new CTcDataStream(TCGEN_STATIC_INIT_ID_STREAM);

    /* create the local variable name stream */
    G_lcl_stream = new CTcDataStream(TCGEN_LCL_VAR_STREAM);

    /* create the target-specific code generator */
    G_cg = new CTcGenTarg();

    /* initialize the parser */
    G_prs->init();

    /* no errors or warnings yet */
    error_count_ = 0;
    warning_count_ = 0;
    first_error_ = 0;
    first_warning_ = 0;

    /* set a fairly liberal maximum error limit */
    max_error_count_ = 100;

    /* there's no disassembly output stream yet */
    G_disasm_out = 0;
}